

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_handle.cpp
# Opt level: O0

SysCallInt64Result cppnet::OsHandle::TcpSocket(bool ipv4)

{
  int iVar1;
  int *piVar2;
  SysCallInt64Result SVar3;
  int64_t sock;
  int domain;
  bool ipv4_local;
  undefined4 local_10;
  
  sock._0_4_ = 10;
  if (ipv4) {
    sock._0_4_ = 2;
  }
  iVar1 = socket((int)sock,1,0);
  SVar3._return_value = (long)iVar1;
  if (SVar3._return_value < 0) {
    piVar2 = __errno_location();
    local_10 = *piVar2;
  }
  else {
    local_10 = 0;
  }
  SVar3._errno = local_10;
  SVar3._12_4_ = 0;
  return SVar3;
}

Assistant:

SysCallInt64Result OsHandle::TcpSocket(bool ipv4) {
    int domain = PF_INET6;
    if (ipv4) {
        domain = PF_INET;
    }

    int64_t sock = socket(domain, SOCK_STREAM, 0);
    if (sock < 0) {
        return {sock, errno};
    }
    return {sock, 0};
}